

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void rffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  float *ioptr_00;
  long StageCnt_00;
  float *in_RCX;
  long in_RDX;
  long in_RSI;
  float *in_RDI;
  long in_R8;
  long unaff_retaddr;
  long NDiffU;
  long StageCnt;
  float scale;
  long in_stack_00000068;
  long in_stack_00000070;
  long in_stack_00000078;
  float *in_stack_00000080;
  long in_stack_00000088;
  float *in_stack_00000090;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar1;
  
  ioptr_00 = (float *)(in_RSI + -1);
  switch(in_RSI) {
  case 0:
    break;
  case 1:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      rfft1pt(in_RDI);
      in_RDI = in_RDI + (1L << ((byte)ioptr_00 & 0x3f)) * 2;
    }
  case 2:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      rfft2pt(in_RDI);
      in_RDI = in_RDI + (1L << ((byte)ioptr_00 & 0x3f)) * 2;
    }
    break;
  case 3:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      rfft4pt(in_RDI);
      in_RDI = in_RDI + (1L << ((byte)ioptr_00 & 0x3f)) * 2;
    }
    break;
  case 4:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      rfft8pt(in_RDI);
      in_RDI = in_RDI + (1L << ((byte)ioptr_00 & 0x3f)) * 2;
    }
    break;
  default:
    uVar1 = 0x3f000000;
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      scbitrevR2((float *)NDiffU,unaff_retaddr,(short *)in_RDI,(float)((ulong)ioptr_00 >> 0x20));
      StageCnt_00 = ((long)ioptr_00 + -1) / 3;
      if ((long)ioptr_00 + StageCnt_00 * -3 + -1 == 1) {
        bfR2(in_RCX,in_R8,CONCAT44(uVar1,in_stack_ffffffffffffffd0));
      }
      if ((long)ioptr_00 + StageCnt_00 * -3 + -1 == 2) {
        bfR4(ioptr_00,in_RDX,(long)in_RCX);
      }
      if (ioptr_00 < (float *)0xc) {
        bfstages(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                 in_stack_00000070,in_stack_00000068);
        frstage(in_RDI,(long)ioptr_00 + 1,in_RCX);
      }
      else {
        fftrecurs(ioptr_00,in_RDX,in_RCX,in_R8,CONCAT44(uVar1,in_stack_ffffffffffffffd0),StageCnt_00
                 );
        frstage(in_RDI,(long)ioptr_00 + 1,in_RCX);
      }
      in_RDI = in_RDI + (1L << ((byte)ioptr_00 & 0x3f)) * 2;
    }
  }
  return;
}

Assistant:

void rffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place real fft on the rows of the input array	*/
/* The result is the complex spectra of the positive frequencies */
/* except the location for the first complex number contains the real */
/* values for DC and Nyquest */
/* INPUTS */
/* *ioptr = real input data array	*/
/* M = log2 of fft size	*/
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	in the following order */
/* Re(x[0]), Re(x[N/2]), Re(x[1]), Im(x[1]), Re(x[2]), Im(x[2]), ... Re(x[N/2-1]), Im(x[N/2-1]). */

float	scale;
long 	StageCnt;
long 	NDiffU;

M=M-1;
switch (M){
case -1:
	break;
case 0:
	for (;Rows>0;Rows--){
		rfft1pt(ioptr);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
case 1:
	for (;Rows>0;Rows--){
		rfft2pt(ioptr);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		rfft4pt(ioptr);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		rfft8pt(ioptr);				/* a 16 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	scale = 0.5;
	for (;Rows>0;Rows--){

		scbitrevR2(ioptr, M, BRLow, scale);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			bfR2(ioptr, M, NDiffU);			/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			bfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE){
			bfstages(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
			frstage(ioptr, M+1, Utbl);
		}

		else{
			fftrecurs(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
			frstage(ioptr, M+1, Utbl);
		}

		ioptr += 2*POW2(M);
	}
}
}